

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<int_volatile&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args)

{
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  basic_string_view<char> fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int *args_01;
  v8 *this_00;
  undefined8 in_RDI;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *in_R8;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  logger *in_stack_fffffffffffffba8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffbb0;
  level_enum lvl_00;
  log_msg *in_stack_fffffffffffffc10;
  string_view_t in_stack_fffffffffffffc18;
  string_view_t in_stack_fffffffffffffc28;
  source_loc in_stack_fffffffffffffc40;
  basic_string_view<char> local_358;
  buffer<char> *in_stack_fffffffffffffcb8;
  locale_ref in_stack_fffffffffffffcc0;
  unsigned_long_long in_stack_fffffffffffffcc8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  locale_ref local_2c0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *local_2b8 [2];
  undefined8 local_2a8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  v8 local_269;
  buffer<char> local_268 [9];
  undefined1 local_142;
  byte local_141;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_40;
  undefined8 *local_38;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_30;
  undefined8 local_28;
  undefined8 *local_20;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> **local_18;
  
  lvl_00 = (level_enum)((ulong)in_RDI >> 0x20);
  local_140 = in_R8;
  local_128 = in_RDX;
  uStack_120 = in_RCX;
  local_141 = should_log(in_stack_fffffffffffffba8,
                         (level_enum)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  local_142 = details::backtracer::enabled((backtracer *)0x1eff0b);
  if (((local_141 & 1) != 0) || ((bool)local_142)) {
    this_00 = &local_269;
    std::allocator<char>::allocator();
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffba0,(allocator<char> *)in_stack_fffffffffffffb98);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    local_298 = local_128;
    uStack_290 = uStack_120;
    local_2b8[0] = ::fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int_volatile&>
                             (local_140,this_00,args_01);
    local_38 = &local_2a8;
    local_40 = local_2b8;
    local_28 = 1;
    local_2a8 = 1;
    local_30 = local_40;
    local_20 = local_38;
    local_18 = local_40;
    local_2a0 = local_40;
    ::fmt::v8::detail::locale_ref::locale_ref(&local_2c0);
    fmt_00.size_ = in_stack_fffffffffffffce0;
    fmt_00.data_ = in_stack_fffffffffffffcd8;
    args_00.field_1.values_ = in_stack_fffffffffffffcd0.values_;
    args_00.desc_ = in_stack_fffffffffffffcc8;
    ::fmt::v8::detail::vformat_to<char>
              (in_stack_fffffffffffffcb8,fmt_00,args_00,in_stack_fffffffffffffcc0);
    ::fmt::v8::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    s = ::fmt::v8::detail::buffer<char>::data(local_268);
    count = ::fmt::v8::detail::buffer<char>::size(local_268);
    log_msg_00 = in_stack_00000018;
    ::fmt::v8::basic_string_view<char>::basic_string_view(&local_358,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc40,in_stack_fffffffffffffc28,lvl_00,
               in_stack_fffffffffffffc18);
    log_it_(in_stack_fffffffffffffbb0,log_msg_00,SUB81((ulong)in_stack_00000010 >> 0x38,0),
            SUB81((ulong)in_stack_00000010 >> 0x30,0));
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (in_stack_00000010);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(std::forward<Args>(args)...));
#else
            // seems that fmt::detail::vformat_to(buf, ...) is ~20ns faster than fmt::vformat_to(std::back_inserter(buf),..)
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(std::forward<Args>(args)...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }